

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MagneticField.cpp
# Opt level: O1

void __thiscall OpenMD::MagneticField::modifyForces(MagneticField *this)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  AtomType *pAVar4;
  Snapshot *pSVar5;
  RealType RVar6;
  double dVar7;
  bool bVar8;
  uint i_1;
  Molecule *pMVar9;
  long lVar10;
  uint i_3;
  ulong uVar11;
  uint j;
  long lVar12;
  ulong uVar13;
  uint i_5;
  long lVar14;
  double (*padVar15) [3];
  SquareMatrix3<double> *pSVar16;
  pointer ppAVar17;
  double (*__return_storage_ptr__) [3];
  Atom *pAVar18;
  byte bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  Vector<double,_3U> result_1;
  Vector3d omega;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  Vector3d f;
  MultipoleAdapter ma;
  Vector3d AngMomentum;
  Vector3d t;
  Vector<double,_3U> result_2;
  Mat3x3d I;
  double local_1d8 [4];
  double local_1b8 [4];
  FixedChargeAdapter local_198;
  MoleculeIterator local_190;
  double local_188 [4];
  double local_168;
  undefined8 uStack_160;
  double local_158;
  double dStack_150;
  MultipoleAdapter local_148;
  double dStack_140;
  double local_138;
  double local_128 [4];
  undefined1 local_108 [16];
  double local_f8;
  double local_e8 [10];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  SquareMatrix3<double> local_78;
  
  bVar19 = 0;
  if (this->initialized == false) {
    initialize(this);
  }
  local_190._M_node = (_Base_ptr)0x0;
  local_188[2] = 0.0;
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_f8 = 0.0;
  local_108 = ZEXT816(0);
  local_128[2] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_1b8[2] = 0.0;
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  if (this->doMagneticField == true) {
    pMVar9 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_190);
    while (pMVar9 != (Molecule *)0x0) {
      ppAVar17 = (pMVar9->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      while( true ) {
        if (ppAVar17 ==
            (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar18 = (Atom *)0x0;
        }
        else {
          pAVar18 = *ppAVar17;
        }
        if (pAVar18 == (Atom *)0x0) break;
        pAVar4 = pAVar18->atomType_;
        lVar12 = (long)(pAVar18->super_StuntDouble).localIndex_;
        lVar10 = *(long *)((long)&(((pAVar18->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                  atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (pAVar18->super_StuntDouble).storage_);
        pdVar1 = (double *)(lVar10 + lVar12 * 0x18);
        local_158 = *pdVar1;
        dStack_150 = pdVar1[1];
        local_168 = *(double *)(lVar10 + 0x10 + lVar12 * 0x18);
        uStack_160 = 0;
        local_198.at_ = pAVar4;
        bVar8 = FixedChargeAdapter::isFixedCharge(&local_198);
        if (bVar8) {
          RVar6 = FixedChargeAdapter::getCharge(&local_198);
          dVar2 = (this->MF).super_Vector<double,_3U>.data_[0];
          dVar22 = (this->MF).super_Vector<double,_3U>.data_[1];
          dVar7 = (this->MF).super_Vector<double,_3U>.data_[2];
          local_148.at_ = (AtomType *)(dVar7 * dStack_150 - local_168 * dVar22);
          dStack_140 = dVar2 * local_168 - local_158 * dVar7;
          local_138 = local_158 * dVar22 - dStack_150 * dVar2;
          local_1d8[0] = 0.0;
          local_1d8[1] = 0.0;
          local_1d8[2] = 0.0;
          lVar10 = 0;
          do {
            local_1d8[lVar10] = (double)(&local_148)[lVar10].at_ * RVar6 * 23.0609;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          lVar10 = 0;
          do {
            local_e8[lVar10] = local_1d8[lVar10] * 1e-05;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_188[2] = local_e8[2];
          local_188[0] = local_e8[0];
          local_188[1] = local_e8[1];
          lVar10 = (long)(pAVar18->super_StuntDouble).localIndex_ * 0x18 +
                   *(long *)((long)&(((pAVar18->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).force.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar18->super_StuntDouble).storage_);
          lVar12 = 0;
          do {
            *(double *)(lVar10 + lVar12 * 8) = local_188[lVar12] + *(double *)(lVar10 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
        }
        local_148.at_ = pAVar4;
        bVar8 = MultipoleAdapter::isDipole(&local_148);
        if (bVar8) {
          lVar12 = (long)(pAVar18->super_StuntDouble).localIndex_;
          lVar10 = *(long *)((long)&(((pAVar18->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).dipole.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar18->super_StuntDouble).storage_);
          local_1d8[2] = *(double *)(lVar10 + 0x10 + lVar12 * 0x18);
          pdVar1 = (double *)(lVar10 + lVar12 * 0x18);
          local_1d8[0] = *pdVar1;
          local_1d8[1] = pdVar1[1];
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          lVar10 = 0;
          do {
            local_e8[lVar10] = local_1d8[lVar10] * 4.8018969509;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          dVar2 = (this->MF).super_Vector<double,_3U>.data_[0];
          dVar22 = (this->MF).super_Vector<double,_3U>.data_[1];
          dVar7 = (this->MF).super_Vector<double,_3U>.data_[2];
          dVar23 = local_168 * dVar2 - dVar7 * local_158;
          dVar21 = local_158 * dVar22 - dVar2 * dStack_150;
          dVar22 = dStack_150 * dVar7 - dVar22 * local_168;
          local_168 = local_e8[2];
          uStack_160 = 0;
          local_158 = local_e8[0];
          dStack_150 = local_e8[1];
          local_98 = local_e8[2];
          dStack_90 = local_e8[0];
          dVar2 = local_e8[2] * dVar22 - dVar21 * local_e8[0];
          local_88 = local_e8[1];
          dStack_80 = local_e8[1];
          local_108._8_4_ = SUB84(dVar2,0);
          local_108._0_8_ = local_e8[1] * dVar21 - dVar23 * local_e8[2];
          local_108._12_4_ = (int)((ulong)dVar2 >> 0x20);
          local_f8 = local_e8[0] * dVar23 - dVar22 * local_e8[1];
          pSVar5 = ((pAVar18->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          lVar10 = (long)(pAVar18->super_StuntDouble).localIndex_;
          lVar12 = lVar10 * 0x18 +
                   *(long *)((long)&(pSVar5->atomData).torque.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar18->super_StuntDouble).storage_);
          lVar14 = 0;
          do {
            *(double *)(lVar12 + lVar14 * 8) =
                 *(double *)(local_108 + lVar14 * 8) + *(double *)(lVar12 + lVar14 * 8);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          lVar12 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar18->super_StuntDouble).storage_);
          local_128[2] = *(double *)(lVar12 + 0x10 + lVar10 * 0x18);
          pdVar1 = (double *)(lVar12 + lVar10 * 0x18);
          local_128[0] = *pdVar1;
          local_128[1] = pdVar1[1];
          __return_storage_ptr__ = (double (*) [3])local_e8;
          (*(pAVar18->super_StuntDouble)._vptr_StuntDouble[5])(__return_storage_ptr__,pAVar18);
          padVar15 = __return_storage_ptr__;
          pSVar16 = &local_78;
          for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pSVar16->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                 (((SquareMatrix3<double> *)padVar15)->super_SquareMatrix<double,_3>).
                 super_RectMatrix<double,_3U,_3U>.data_[0][0];
            padVar15 = (double (*) [3])((long)padVar15 + ((ulong)bVar19 * -2 + 1) * 8);
            pSVar16 = (SquareMatrix3<double> *)((long)pSVar16 + ((ulong)bVar19 * -2 + 1) * 8);
          }
          if ((pAVar18->super_StuntDouble).linear_ == true) {
            uVar3 = (pAVar18->super_StuntDouble).linearAxis_;
            uVar11 = (ulong)(((int)(uVar3 + 1) / 3) * -3 + uVar3 + 1);
            uVar13 = (ulong)(((int)(uVar3 + 2) / 3) * -3 + uVar3 + 2);
            dVar2 = local_128[uVar11];
            dVar22 = *(double *)
                      ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                             .data_ + uVar11 * 0x20);
            local_1b8[uVar3] = 0.0;
            local_1b8[uVar11] = dVar2 / dVar22;
            local_1b8[uVar13] =
                 local_128[uVar13] /
                 *(double *)
                  ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_ + uVar13 * 0x20);
          }
          else {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)__return_storage_ptr__,&local_78);
            local_1d8[0] = 0.0;
            local_1d8[1] = 0.0;
            local_1d8[2] = 0.0;
            lVar10 = 0;
            do {
              dVar2 = local_1d8[lVar10];
              lVar12 = 0;
              do {
                dVar2 = dVar2 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                                super_RectMatrix<double,_3U,_3U>).data_[0][lVar12] *
                                local_128[lVar12];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 3);
              local_1d8[lVar10] = dVar2;
              lVar10 = lVar10 + 1;
              __return_storage_ptr__ = __return_storage_ptr__ + 1;
            } while (lVar10 != 3);
            local_1b8[2] = local_1d8[2];
            local_1b8[0] = local_1d8[0];
            local_1b8[1] = local_1d8[1];
          }
          dVar2 = (this->MF).super_Vector<double,_3U>.data_[0];
          dVar20 = local_1b8[1] * local_168 - local_88 * local_1b8[2];
          dVar22 = local_1b8[2] * local_158 - local_98 * local_1b8[0];
          dVar7 = local_1b8[0] * dStack_150 - dStack_90 * local_1b8[1];
          dVar21 = (this->MF).super_Vector<double,_3U>.data_[1];
          dVar23 = (this->MF).super_Vector<double,_3U>.data_[2];
          local_188[0] = dVar23 * dVar22 - dVar7 * dVar21;
          local_188[1] = dVar2 * dVar7 - dVar20 * dVar23;
          local_188[2] = dVar20 * dVar21 - dVar22 * dVar2;
          lVar10 = (long)(pAVar18->super_StuntDouble).localIndex_ * 0x18 +
                   *(long *)((long)&(((pAVar18->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).force.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar18->super_StuntDouble).storage_);
          lVar12 = 0;
          do {
            *(double *)(lVar10 + lVar12 * 8) = local_188[lVar12] + *(double *)(lVar10 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
        }
        ppAVar17 = ppAVar17 + 1;
      }
      pMVar9 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_190);
    }
  }
  return;
}

Assistant:

void MagneticField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;

    int l, m, n;
    RealType C;
    Vector3d v;
    Vector3d f;
    Vector3d r;
    Vector3d t;
    Vector3d D;
    Vector3d AngMomentum;
    Vector3d omega;
    Mat3x3d I;
    bool isCharge;

    if (doMagneticField) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();
          r     = atom->getPos();
          v     = atom->getVel();

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          C *= Constants::chargeFieldConvert;

          if (isCharge) {
            f = cross(v, MF) * C * Constants::magneticFieldConvert;
            atom->addFrc(f);
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, cross(v, MF));
            atom->addTrq(t);

            AngMomentum = atom->getJ();
            I           = atom->getI();
            if (atom->isLinear()) {
              l        = atom->linearAxis();
              m        = (l + 1) % 3;
              n        = (l + 2) % 3;
              omega[l] = 0;
              omega[m] = AngMomentum[m] / I(m, m);
              omega[n] = AngMomentum[n] / I(n, n);
            } else {
              omega = I.inverse() * AngMomentum;
            }

            f = cross(cross(omega, D), MF);
            atom->addFrc(f);
          }
        }
      }
    }
  }